

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O1

Vec_Int_t *
Fra_SmlSelectMaxCost(Vec_Int_t *vImps,int *pCosts,int nCostMax,int nImpLimit,int *pCostRange)

{
  size_t __size;
  uint uVar1;
  bool bVar2;
  int iVar3;
  int *__s;
  ulong uVar4;
  Vec_Int_t *p;
  int *piVar5;
  long lVar6;
  
  uVar1 = vImps->nSize;
  if ((int)uVar1 < nImpLimit) {
    __assert_fail("Vec_IntSize(vImps) >= nImpLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraImp.c"
                  ,0xf8,"Vec_Int_t *Fra_SmlSelectMaxCost(Vec_Int_t *, int *, int, int, int *)");
  }
  __size = (long)nCostMax * 4 + 4;
  __s = (int *)malloc(__size);
  memset(__s,0,__size);
  if (0 < (int)uVar1) {
    uVar4 = 0;
    do {
      if (nCostMax < pCosts[uVar4]) {
        __assert_fail("pCosts[i] <= nCostMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraImp.c"
                      ,0xfe,"Vec_Int_t *Fra_SmlSelectMaxCost(Vec_Int_t *, int *, int, int, int *)");
      }
      __s[pCosts[uVar4]] = __s[pCosts[uVar4]] + 1;
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  if (*__s != 0) {
    __assert_fail("pCostCount[0] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraImp.c"
                  ,0x101,"Vec_Int_t *Fra_SmlSelectMaxCost(Vec_Int_t *, int *, int, int, int *)");
  }
  if (0 < nCostMax) {
    iVar3 = 0;
    do {
      iVar3 = iVar3 + __s[(uint)nCostMax];
      if (nImpLimit <= iVar3) goto LAB_0065dd1b;
      bVar2 = 1 < nCostMax;
      nCostMax = nCostMax - 1;
    } while (bVar2);
    nCostMax = 0;
  }
LAB_0065dd1b:
  p = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < nImpLimit - 1U) {
    iVar3 = nImpLimit;
  }
  p->nSize = 0;
  p->nCap = iVar3;
  if (iVar3 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar3 << 2);
  }
  p->pArray = piVar5;
  if (0 < vImps->nSize) {
    lVar6 = 0;
    do {
      if (nCostMax <= pCosts[lVar6]) {
        Vec_IntPush(p,vImps->pArray[lVar6]);
        if (p->nSize == nImpLimit) break;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < vImps->nSize);
  }
  free(__s);
  if (pCostRange != (int *)0x0) {
    *pCostRange = nCostMax;
  }
  return p;
}

Assistant:

Vec_Int_t * Fra_SmlSelectMaxCost( Vec_Int_t * vImps, int * pCosts, int nCostMax, int nImpLimit, int * pCostRange )
{
    Vec_Int_t * vImpsNew;
    int * pCostCount, nImpCount, Imp, i, c;
    assert( Vec_IntSize(vImps) >= nImpLimit );
    // count how many implications have each cost
    pCostCount = ABC_ALLOC( int, nCostMax + 1 );
    memset( pCostCount, 0, sizeof(int) * (nCostMax + 1) );
    for ( i = 0; i < Vec_IntSize(vImps); i++ )
    {
        assert( pCosts[i] <= nCostMax );
        pCostCount[ pCosts[i] ]++;
    }
    assert( pCostCount[0] == 0 );
    // select the bound on the cost (above this bound, implication will be included)
    nImpCount = 0;
    for ( c = nCostMax; c > 0; c-- )
    {
        nImpCount += pCostCount[c];
        if ( nImpCount >= nImpLimit )
            break;
    }
//    printf( "Cost range >= %d.\n", c );
    // collect implications with the given costs
    vImpsNew = Vec_IntAlloc( nImpLimit );
    Vec_IntForEachEntry( vImps, Imp, i )
    {
        if ( pCosts[i] < c )
            continue;
        Vec_IntPush( vImpsNew, Imp );
        if ( Vec_IntSize( vImpsNew ) == nImpLimit )
            break;
    }
    ABC_FREE( pCostCount );
    if ( pCostRange )
        *pCostRange = c;
    return vImpsNew;
}